

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O2

int TestConfigExDataIndex(void)

{
  int iVar1;
  
  if (TestConfigExDataIndex()::index == '\0') {
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      iVar1 = SSL_get_ex_new_index
                        (0,(void *)0x0,(undefined1 *)0x0,(undefined1 *)0x0,(undefined1 *)0x0);
      if (iVar1 < 0) {
        abort();
      }
      TestConfigExDataIndex::index = iVar1;
      __cxa_guard_release(&TestConfigExDataIndex()::index);
    }
  }
  return TestConfigExDataIndex::index;
}

Assistant:

static int TestConfigExDataIndex() {
  static int index = [&] {
    OPENSSL_disable_malloc_failures_for_testing();
    int ret = SSL_get_ex_new_index(0, nullptr, nullptr, nullptr, nullptr);
    BSSL_CHECK(ret >= 0);
    OPENSSL_enable_malloc_failures_for_testing();
    return ret;
  }();
  return index;
}